

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O3

void Gia_IsoAssignOneClass(Gia_IsoMan_t *p,int fVerbose)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int *piVar4;
  word *pwVar5;
  Vec_Int_t *pVVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  
  pVVar6 = p->vClasses;
  uVar7 = pVVar6->nSize;
  uVar8 = (ulong)(int)uVar7;
  if ((long)uVar8 < 1) {
    __assert_fail("Vec_IntSize(p->vClasses) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                  ,0x24f,"void Gia_IsoAssignOneClass(Gia_IsoMan_t *, int)");
  }
  if (uVar7 == 1) {
LAB_00751790:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar13 = uVar7 + 2;
  uVar11 = uVar8;
  do {
    uVar14 = uVar7 & 1;
    if ((long)uVar11 < 2) break;
    if (uVar7 <= uVar13 - 4) goto LAB_00751790;
    lVar9 = uVar11 - 2;
    uVar13 = uVar13 - 2;
    uVar11 = uVar11 - 2;
    uVar14 = uVar13;
  } while (p->pLevels[*(uint *)((long)p->pStoreW + (long)pVVar6->pArray[lVar9] * 8 + 4)] ==
           p->pLevels[*(uint *)((long)p->pStoreW + (long)pVVar6->pArray[uVar8 - 2] * 8 + 4)]);
  if ((int)uVar14 < (int)uVar7) {
    uVar11 = (ulong)uVar14;
    do {
      if ((int)uVar8 <= (int)uVar11 + 1) goto LAB_00751790;
      lVar9 = (long)pVVar6->pArray[uVar11];
      lVar10 = (long)pVVar6->pArray[uVar11 + 1];
      if (0 < lVar10) {
        piVar4 = p->pUniques;
        pwVar5 = p->pStoreW;
        lVar12 = 0;
        do {
          uVar8 = pwVar5[lVar9 + lVar12] >> 0x20;
          if (piVar4[uVar8] != 0) {
            __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin+k)] == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                          ,0x260,"void Gia_IsoAssignOneClass(Gia_IsoMan_t *, int)");
          }
          iVar3 = p->nUniques;
          p->nUniques = iVar3 + 1;
          piVar4[uVar8] = iVar3;
          uVar1 = p->nSingles;
          uVar2 = p->nEntries;
          p->nSingles = uVar1 + 1;
          p->nEntries = uVar2 + -1;
          lVar12 = lVar12 + 1;
        } while (lVar10 != lVar12);
      }
      if (fVerbose != 0) {
        printf("Broke ties in class of size %d at level %d.\n",lVar10,
               (ulong)(uint)p->pLevels[*(uint *)((long)p->pStoreW + lVar9 * 8 + 4)]);
        pVVar6 = p->vClasses;
      }
      uVar11 = uVar11 + 2;
      uVar7 = pVVar6->nSize;
      uVar8 = (ulong)uVar7;
    } while ((int)uVar11 < (int)uVar7);
  }
  if ((int)uVar7 < (int)uVar14) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  pVVar6->nSize = uVar14;
  return;
}

Assistant:

void Gia_IsoAssignOneClass( Gia_IsoMan_t * p, int fVerbose )
{
    int i, k, iBegin0, iBegin, nSize, Shrink;
    // find the classes with the highest level
    assert( Vec_IntSize(p->vClasses) > 0 );
    iBegin0 = Vec_IntEntry( p->vClasses, Vec_IntSize(p->vClasses) - 2 );
    for ( i = Vec_IntSize(p->vClasses) - 2; i >= 0; i -= 2 )
    {
        iBegin = Vec_IntEntry( p->vClasses, i );
        if ( p->pLevels[Gia_IsoGetItem(p, iBegin)] != p->pLevels[Gia_IsoGetItem(p, iBegin0)] )
            break;
    }
    i += 2;
    assert( i >= 0 );
    // assign all classes starting with this one
    for ( Shrink = i; i < Vec_IntSize(p->vClasses); i += 2 )
    {
        iBegin = Vec_IntEntry( p->vClasses, i );
        nSize  = Vec_IntEntry( p->vClasses, i + 1 );
        for ( k = 0; k < nSize; k++ )
        {
            assert( p->pUniques[Gia_IsoGetItem(p, iBegin+k)] == 0 );
            p->pUniques[Gia_IsoGetItem(p, iBegin+k)] = p->nUniques++;
//            Gia_ManObj(p->pGia, Gia_IsoGetItem(p, iBegin+k))->Value += s_256Primes[0]; ///  new addition!!!
            p->nSingles++;
            p->nEntries--;
        }
        if ( fVerbose )
            printf( "Broke ties in class of size %d at level %d.\n", nSize, p->pLevels[Gia_IsoGetItem(p, iBegin)] );
    }
    Vec_IntShrink( p->vClasses, Shrink );
}